

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_test.cc
# Opt level: O0

void __thiscall xLearn::LossTest_Predict_FFM_Test::TestBody(LossTest_Predict_FFM_Test *this)

{
  index_t iVar1;
  ThreadPool *this_00;
  reference pvVar2;
  value_type pvVar3;
  reference ppvVar4;
  void *pvVar5;
  vector<float,_std::allocator<float>_> *this_01;
  char *message;
  AssertionResult gtest_ar;
  int i_3;
  vector<float,_std::allocator<float>_> pred;
  ThreadPool *pool;
  size_t threadNumber;
  Score *score;
  TestLoss loss;
  int j;
  int i_2;
  DMatrix matrix;
  size_t i_1;
  index_t num_v;
  real_t *v;
  size_t i;
  index_t num_w;
  real_t *w;
  char *in_stack_00000190;
  char *in_stack_00000198;
  Model model_ffm;
  real_t in_stack_00000390;
  index_t in_stack_00000394;
  index_t in_stack_00000398;
  index_t in_stack_0000039c;
  string *in_stack_000003a0;
  string *in_stack_000003a8;
  Model *in_stack_000003b0;
  index_t in_stack_000003c0;
  Model *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined1 *__n;
  undefined4 in_stack_fffffffffffffe08;
  AssertHelper local_1d8;
  Message local_1d0;
  AssertionResult local_1c8;
  uint local_1b8;
  undefined1 local_1b1;
  vector<float,_std::allocator<float>_> local_1b0;
  vector<float,_std::allocator<float>_> *local_198;
  ulong local_190;
  void *local_188;
  undefined1 in_stack_fffffffffffffeb7;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar6;
  undefined4 in_stack_fffffffffffffebc;
  uint uVar7;
  index_t in_stack_fffffffffffffec0;
  real_t in_stack_fffffffffffffec4;
  index_t in_stack_fffffffffffffec8;
  index_t in_stack_fffffffffffffecc;
  DMatrix *in_stack_fffffffffffffed0;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  vStack_128;
  vector<float,_std::allocator<float>_> local_110 [2];
  ulong local_d8;
  index_t local_cc;
  ThreadPool *local_c8;
  ulong local_c0;
  index_t local_b4;
  real_t *local_b0;
  index_t in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  ThreadPool *in_stack_ffffffffffffffe0;
  Score *in_stack_ffffffffffffffe8;
  Loss *in_stack_fffffffffffffff0;
  
  Model::Model(in_stack_fffffffffffffdd0);
  std::__cxx11::string::operator=((string *)(param + 8),"ffm");
  Model::Initialize(in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_0000039c,
                    in_stack_00000398,in_stack_00000394,in_stack_000003c0,in_stack_00000390);
  local_b0 = Model::GetParameter_w((Model *)&stack0xffffffffffffff68);
  local_b4 = Model::GetNumParameter_w((Model *)&stack0xffffffffffffff68);
  for (local_c0 = 0; local_c0 < local_b4; local_c0 = local_c0 + 1) {
    local_b0[local_c0] = 2.0;
  }
  this_00 = (ThreadPool *)Model::GetParameter_v((Model *)&stack0xffffffffffffff68);
  local_c8 = this_00;
  iVar1 = Model::GetNumParameter_v((Model *)&stack0xffffffffffffff68);
  for (local_d8 = 0; local_d8 < iVar1; local_d8 = local_d8 + 1) {
    *(real_t *)
     ((long)&(local_c8->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start + local_d8 * 4) = 1.0;
  }
  local_cc = iVar1;
  DMatrix::DMatrix((DMatrix *)this_00);
  DMatrix::ReAlloc((DMatrix *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (bool)in_stack_fffffffffffffeb7);
  for (uVar7 = 0; uVar7 < 10; uVar7 = uVar7 + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_110,(long)(int)uVar7);
    *pvVar2 = 0.0;
    pvVar3 = (value_type)operator_new(0x18);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x189b99);
    ppvVar4 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[](&vStack_128,(long)(int)uVar7);
    *ppvVar4 = pvVar3;
    for (uVar6 = 0; uVar6 < (uint)param._184_4_; uVar6 = uVar6 + 1) {
      DMatrix::AddNode(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                       ,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0);
    }
  }
  TestLoss::TestLoss((TestLoss *)in_stack_fffffffffffffdd0);
  pvVar5 = operator_new(0x60);
  FFMScore::FFMScore((FFMScore *)in_stack_fffffffffffffdd0);
  local_188 = pvVar5;
  uVar7 = std::thread::hardware_concurrency();
  local_190 = (ulong)uVar7;
  this_01 = (vector<float,_std::allocator<float>_> *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,CONCAT44(iVar1,in_stack_fffffffffffffe08));
  local_198 = this_01;
  Loss::Initialize(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                   (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde,
                   in_stack_ffffffffffffffd8);
  __n = &local_1b1;
  std::allocator<float>::allocator((allocator<float> *)0x189cf7);
  std::vector<float,_std::allocator<float>_>::vector
            (this_01,(size_type)__n,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::allocator<float>::~allocator((allocator<float> *)0x189d1d);
  Loss::Predict((Loss *)loss.super_Loss.score_func_,(DMatrix *)loss.super_Loss._vptr_Loss,
                (Model *)score,(vector<float,_std::allocator<float>_> *)threadNumber);
  for (local_1b8 = 0; local_1b8 < 10; local_1b8 = local_1b8 + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](&local_1b0,(long)(int)local_1b8);
    testing::internal::CmpHelperFloatingPointEQ<float>
              (in_stack_00000198,in_stack_00000190,w._4_4_,w._0_4_);
    in_stack_fffffffffffffde7 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!(bool)in_stack_fffffffffffffde7) {
      testing::Message::Message(&local_1d0);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x189e87);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/loss_test.cc"
                 ,0xc6,message);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x189ed5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x189f21);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  TestLoss::~TestLoss((TestLoss *)0x189f5d);
  DMatrix::~DMatrix((DMatrix *)in_stack_fffffffffffffdd0);
  Model::~Model(in_stack_fffffffffffffdd0);
  return;
}

Assistant:

TEST_F(LossTest, Predict_FFM) {
  // Create Model for FFM
  Model model_ffm;
  param.score_func = "ffm";
  model_ffm.Initialize(param.score_func,
                   param.loss_func,
                   param.num_feature,
                   param.num_field,
                   param.num_K,
                   param.auxiliary_size);
  real_t* w = model_ffm.GetParameter_w();
  index_t num_w = model_ffm.GetNumParameter_w();
  for (size_t i = 0; i < num_w; ++i) {
    w[i] = 2.0;
  }
  real_t* v = model_ffm.GetParameter_v();
  index_t num_v = model_ffm.GetNumParameter_v();
  for (size_t i = 0; i < num_v; ++i) {
    v[i] = 1.0;
  }
  // Create Data matrix
  DMatrix matrix;
  matrix.ReAlloc(kLine);
  for (int i = 0; i < kLine; ++i) {
    matrix.Y[i] = 0;
    matrix.row[i] = new SparseRow;
    for (int j = 0; j < param.num_feature; ++j) {
      matrix.AddNode(i, j, 1.0, j);
    }
  }
  // Create loss function
  TestLoss loss;
  Score* score = new FFMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  // Test
  std::vector<real_t> pred(kLine);
  loss.Predict(&matrix, model_ffm, pred);
  for (int i = 0; i < kLine; ++i) {
    // 6 + 24*1*3
    EXPECT_FLOAT_EQ(pred[i], 78);
  }
}